

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# morph_vertex_list.c
# Opt level: O0

bool_t prf_morph_vertex_list_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int iVar1;
  ushort *in_RDI;
  int count;
  int num;
  uint32_t *ptr;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  bool_t local_4;
  
  if (*in_RDI == prf_morph_vertex_list_info.opcode) {
    bf_put_uint16_be((bfile_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be((bfile_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar1 = (int)(in_RDI[1] - 4) / 4;
    for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      bf_put_uint32_be((bfile_t *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffcc);
    }
    local_4 = 1;
  }
  else {
    prf_error(9,"tried morph vertex list save method on node of type %d.",(ulong)*in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
bool_t
prf_morph_vertex_list_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint32_t * ptr;
    int num, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_morph_vertex_list_info.opcode ) {
        prf_error( 9, "tried morph vertex list save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        bf_put_uint32_be( bfile, ptr[num] );
        num++;
    }

    return TRUE;
}